

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty_validity.hpp
# Opt level: O2

CompressionFunction * duckdb::EmptyValidityCompression::CreateFunction(void)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_EMPTY;
  in_RDI->data_type = BIT;
  in_RDI->init_analyze = (compression_init_analyze_t)0x0;
  in_RDI->analyze = (compression_analyze_t)0x0;
  in_RDI->final_analyze = (compression_final_analyze_t)0x0;
  in_RDI->init_compression = InitCompression;
  in_RDI->compress = Compress;
  in_RDI->compress_finalize = FinalizeCompress;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = InitScan;
  in_RDI->scan_vector = Scan;
  in_RDI->scan_partial = ScanPartial;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = FetchRow;
  in_RDI->skip = Skip;
  in_RDI->init_segment = InitSegment;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  in_RDI->get_segment_info = (compression_get_segment_info_t)0x0;
  in_RDI->validity = REQUIRES_VALIDITY;
  return in_RDI;
}

Assistant:

static CompressionFunction CreateFunction() {
		return CompressionFunction(CompressionType::COMPRESSION_EMPTY, PhysicalType::BIT, nullptr, nullptr, nullptr,
		                           InitCompression, Compress, FinalizeCompress, InitScan, Scan, ScanPartial, FetchRow,
		                           Skip, InitSegment);
	}